

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<100U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  bool bVar15;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar16;
  int iVar17;
  cpp_dec_float<100U,_int,_void> *pcVar18;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar19;
  long lVar20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<100U,_int,_void> local_2e8;
  cpp_dec_float<100U,_int,_void> local_298;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_240;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_238;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_228;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_220;
  cpp_dec_float<100U,_int,_void> local_218;
  fpclass_type local_1c8;
  int32_t iStack_1c4;
  undefined8 uStack_1c0;
  uint local_1b8 [2];
  uint auStack_1b0 [2];
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint local_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  iVar17 = this->m_i;
  iVar4 = this->m_old_i;
  if (iVar17 != iVar4) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar14 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    iVar17 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_i;
    uVar7 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar14 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar17 = this->m_j;
  iVar4 = this->m_old_j;
  if (iVar17 != iVar4) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar7 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar8 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar9 = *(undefined8 *)puVar2;
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar9;
    *(undefined8 *)(puVar2 + 2) = uVar10;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar8;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar14 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    iVar17 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_j;
    uVar9 = *(undefined8 *)&pnVar5[iVar17].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)puVar2;
    uVar8 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
    uVar11 = *(undefined8 *)puVar2;
    uVar12 = *(undefined8 *)(puVar2 + 2);
    puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
    uVar13 = *(undefined8 *)(puVar2 + 2);
    puVar3 = pnVar5[iVar4].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar13;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar2 = uVar11;
    *(undefined8 *)(puVar2 + 2) = uVar12;
    puVar2 = pnVar5[iVar4].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = uVar7;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar9;
    *(undefined8 *)(pnVar5[iVar4].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar17].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar17].m_backend.neg;
    iVar14 = pnVar5[iVar17].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar17].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar14;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_178.fpclass = cpp_dec_float_finite;
  local_178.prec_elem = 0x10;
  local_178.data._M_elems[0] = 0;
  local_178.data._M_elems[1] = 0;
  local_178.data._M_elems[2] = 0;
  local_178.data._M_elems[3] = 0;
  local_178.data._M_elems[4] = 0;
  local_178.data._M_elems[5] = 0;
  local_178.data._M_elems[6] = 0;
  local_178.data._M_elems[7] = 0;
  local_178.data._M_elems[8] = 0;
  local_178.data._M_elems[9] = 0;
  local_178.data._M_elems[10] = 0;
  local_178.data._M_elems[0xb] = 0;
  local_178.data._M_elems[0xc] = 0;
  local_178.data._M_elems[0xd] = 0;
  local_178.data._M_elems._56_5_ = 0;
  local_178.data._M_elems[0xf]._1_3_ = 0;
  local_178.exp = 0;
  local_178.neg = false;
  local_238 = s;
  local_230 = y;
  local_228 = r;
  local_220 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_178,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  iVar17 = (this->m_row).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .memused;
  if (0 < iVar17) {
    lVar19 = 0;
    lVar20 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      iVar4 = *(int *)((long)(&pNVar6->val + 1) + lVar19);
      if (iVar4 != this->m_j) {
        pcVar18 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend;
        pcVar1 = (cpp_dec_float<100U,_int,_void> *)
                 ((long)(pNVar6->val).m_backend.data._M_elems + lVar19);
        local_2e8.fpclass = cpp_dec_float_finite;
        local_2e8.prec_elem = 0x10;
        local_2e8.data._M_elems[0] = 0;
        local_2e8.data._M_elems[1] = 0;
        local_2e8.data._M_elems[2] = 0;
        local_2e8.data._M_elems[3] = 0;
        local_2e8.data._M_elems[4] = 0;
        local_2e8.data._M_elems[5] = 0;
        local_2e8.data._M_elems[6] = 0;
        local_2e8.data._M_elems[7] = 0;
        local_2e8.data._M_elems[8] = 0;
        local_2e8.data._M_elems[9] = 0;
        local_2e8.data._M_elems[10] = 0;
        local_2e8.data._M_elems[0xb] = 0;
        local_2e8.data._M_elems[0xc] = 0;
        local_2e8.data._M_elems[0xd] = 0;
        local_2e8.data._M_elems._56_5_ = 0;
        local_2e8.data._M_elems[0xf]._1_3_ = 0;
        local_2e8.exp = 0;
        local_2e8.neg = false;
        v = pcVar1;
        if ((&local_2e8 != pcVar18) && (v = pcVar18, pcVar1 != &local_2e8)) {
          local_2e8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_2e8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_2e8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          local_2e8.data._M_elems._24_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_2e8.data._M_elems._32_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_2e8.data._M_elems._40_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 10);
          local_2e8.data._M_elems._48_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 0xc);
          uVar7 = *(undefined8 *)((pcVar1->data)._M_elems + 0xe);
          local_2e8.data._M_elems._56_5_ = SUB85(uVar7,0);
          local_2e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_2e8.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar19);
          local_2e8.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar19 + 4);
          local_2e8._72_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar19 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_2e8,v);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&local_178,&local_2e8);
        iVar17 = (this->m_row).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
      }
      lVar20 = lVar20 + 1;
      lVar19 = lVar19 + 0x54;
    } while (lVar20 < iVar17);
  }
  local_2e8.data._M_elems._0_8_ = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  local_2e8.data._M_elems._8_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  local_2e8.data._M_elems._16_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  local_2e8.data._M_elems._24_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  local_2e8.data._M_elems._32_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  local_2e8.data._M_elems._40_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 10);
  local_2e8.data._M_elems._48_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xc);
  uVar7 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 0xe);
  local_2e8.data._M_elems._56_5_ = SUB85(uVar7,0);
  local_2e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  local_2e8.exp = (this->m_lRhs).m_backend.exp;
  local_2e8.neg = (this->m_lRhs).m_backend.neg;
  local_2e8.fpclass = (this->m_lRhs).m_backend.fpclass;
  local_2e8.prec_elem = (this->m_lRhs).m_backend.prec_elem;
  if ((local_2e8.neg == true) &&
     (local_2e8.data._M_elems[0] != 0 || local_2e8.fpclass != cpp_dec_float_finite)) {
    local_2e8.neg = false;
  }
  uVar7._5_3_ = local_178.data._M_elems[0xf]._1_3_;
  uVar7._0_5_ = local_178.data._M_elems._56_5_;
  local_298.data._M_elems[0xc] = local_178.data._M_elems[0xc];
  local_298.data._M_elems[0xd] = local_178.data._M_elems[0xd];
  local_298.data._M_elems[0xe] = local_178.data._M_elems[0xe];
  local_298.data._M_elems[0xf] = SUB84(uVar7,4);
  local_298.data._M_elems[8] = local_178.data._M_elems[8];
  local_298.data._M_elems[9] = local_178.data._M_elems[9];
  local_298.data._M_elems[10] = local_178.data._M_elems[10];
  local_298.data._M_elems[0xb] = local_178.data._M_elems[0xb];
  local_298.data._M_elems[4] = local_178.data._M_elems[4];
  local_298.data._M_elems[5] = local_178.data._M_elems[5];
  local_298.data._M_elems[6] = local_178.data._M_elems[6];
  local_298.data._M_elems[7] = local_178.data._M_elems[7];
  local_298.data._M_elems[0] = local_178.data._M_elems[0];
  local_298.data._M_elems[1] = local_178.data._M_elems[1];
  uVar7 = local_298.data._M_elems._0_8_;
  local_298.data._M_elems[2] = local_178.data._M_elems[2];
  local_298.data._M_elems[3] = local_178.data._M_elems[3];
  local_298.exp = local_178.exp;
  local_298.neg = local_178.neg;
  local_298.fpclass = local_178.fpclass;
  local_298.prec_elem = local_178.prec_elem;
  local_218.fpclass = local_178.fpclass;
  if ((local_178.neg != false) &&
     (local_298.data._M_elems[0] = local_178.data._M_elems[0],
     local_218.fpclass != cpp_dec_float_finite || local_298.data._M_elems[0] != 0)) {
    local_298.neg = (bool)(local_178.neg ^ 1);
  }
  local_298.data._M_elems._0_8_ = uVar7;
  if (local_218.fpclass != cpp_dec_float_NaN && local_2e8.fpclass != cpp_dec_float_NaN) {
    iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_2e8,&local_298);
    if (0 < iVar17) {
      pcVar1 = &local_2e8;
      local_218.data._M_elems[0xf]._1_3_ = local_2e8.data._M_elems[0xf]._1_3_;
      local_218.data._M_elems._56_5_ = local_2e8.data._M_elems._56_5_;
      local_218.data._M_elems[0xc] = local_2e8.data._M_elems[0xc];
      local_218.data._M_elems[0xd] = local_2e8.data._M_elems[0xd];
      local_218.data._M_elems[8] = local_2e8.data._M_elems[8];
      local_218.data._M_elems[9] = local_2e8.data._M_elems[9];
      local_218.data._M_elems[10] = local_2e8.data._M_elems[10];
      local_218.data._M_elems[0xb] = local_2e8.data._M_elems[0xb];
      local_218.data._M_elems[4] = local_2e8.data._M_elems[4];
      local_218.data._M_elems[5] = local_2e8.data._M_elems[5];
      local_218.data._M_elems[6] = local_2e8.data._M_elems[6];
      local_218.data._M_elems[7] = local_2e8.data._M_elems[7];
      local_218.data._M_elems[0] = local_2e8.data._M_elems[0];
      local_218.data._M_elems[1] = local_2e8.data._M_elems[1];
      local_218.data._M_elems[2] = local_2e8.data._M_elems[2];
      local_218.data._M_elems[3] = local_2e8.data._M_elems[3];
      local_218.exp = local_2e8.exp;
      local_218.neg = local_2e8.neg;
      local_218.fpclass = local_2e8.fpclass;
      goto LAB_0043b92f;
    }
    local_218.fpclass = local_298.fpclass;
  }
  pcVar1 = &local_298;
  local_218.data._M_elems[0xc] = local_298.data._M_elems[0xc];
  local_218.data._M_elems[0xd] = local_298.data._M_elems[0xd];
  local_218.data._M_elems[0xe] = local_298.data._M_elems[0xe];
  local_218.data._M_elems[0xf] = local_298.data._M_elems[0xf];
  local_218.data._M_elems[8] = local_298.data._M_elems[8];
  local_218.data._M_elems[9] = local_298.data._M_elems[9];
  local_218.data._M_elems[10] = local_298.data._M_elems[10];
  local_218.data._M_elems[0xb] = local_298.data._M_elems[0xb];
  local_218.data._M_elems[4] = local_298.data._M_elems[4];
  local_218.data._M_elems[5] = local_298.data._M_elems[5];
  local_218.data._M_elems[6] = local_298.data._M_elems[6];
  local_218.data._M_elems[7] = local_298.data._M_elems[7];
  local_218.data._M_elems[0] = local_298.data._M_elems[0];
  local_218.data._M_elems[1] = local_298.data._M_elems[1];
  local_218.data._M_elems[2] = local_298.data._M_elems[2];
  local_218.data._M_elems[3] = local_298.data._M_elems[3];
  local_218.exp = local_298.exp;
  local_218.neg = local_298.neg;
LAB_0043b92f:
  local_218.prec_elem = pcVar1->prec_elem;
  local_240 = x;
  if (local_218.fpclass != cpp_dec_float_NaN) {
    local_2e8.fpclass = cpp_dec_float_finite;
    local_2e8.prec_elem = 0x10;
    local_2e8.data._M_elems[0] = 0;
    local_2e8.data._M_elems[1] = 0;
    local_2e8.data._M_elems[2] = 0;
    local_2e8.data._M_elems[3] = 0;
    local_2e8.data._M_elems[4] = 0;
    local_2e8.data._M_elems[5] = 0;
    local_2e8.data._M_elems[6] = 0;
    local_2e8.data._M_elems[7] = 0;
    local_2e8.data._M_elems[8] = 0;
    local_2e8.data._M_elems[9] = 0;
    local_2e8.data._M_elems[10] = 0;
    local_2e8.data._M_elems[0xb] = 0;
    local_2e8.data._M_elems[0xc] = 0;
    local_2e8.data._M_elems[0xd] = 0;
    local_2e8.data._M_elems._56_5_ = 0;
    local_2e8.data._M_elems[0xf]._1_3_ = 0;
    local_2e8.exp = 0;
    local_2e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_2e8,1.0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_218,&local_2e8);
    if (iVar17 < 0) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_218,1.0);
    }
  }
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 0x10;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems[6] = 0;
  local_2e8.data._M_elems[7] = 0;
  local_2e8.data._M_elems[8] = 0;
  local_2e8.data._M_elems[9] = 0;
  local_2e8.data._M_elems[10] = 0;
  local_2e8.data._M_elems[0xb] = 0;
  local_2e8.data._M_elems[0xc] = 0;
  local_2e8.data._M_elems[0xd] = 0;
  local_2e8.data._M_elems._56_5_ = 0;
  local_2e8.data._M_elems[0xf]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  local_248 = &this->m_lRhs;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2e8,&(this->m_lRhs).m_backend,&local_218);
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_d8,&local_178,&local_218);
  local_298.data._M_elems[0xf]._1_3_ = local_2e8.data._M_elems[0xf]._1_3_;
  local_298.data._M_elems._56_5_ = local_2e8.data._M_elems._56_5_;
  local_298.data._M_elems[0xc] = local_2e8.data._M_elems[0xc];
  local_298.data._M_elems[0xd] = local_2e8.data._M_elems[0xd];
  local_298.data._M_elems[8] = local_2e8.data._M_elems[8];
  local_298.data._M_elems[9] = local_2e8.data._M_elems[9];
  local_298.data._M_elems[10] = local_2e8.data._M_elems[10];
  local_298.data._M_elems[0xb] = local_2e8.data._M_elems[0xb];
  local_298.data._M_elems[4] = local_2e8.data._M_elems[4];
  local_298.data._M_elems[5] = local_2e8.data._M_elems[5];
  local_298.data._M_elems[6] = local_2e8.data._M_elems[6];
  local_298.data._M_elems[7] = local_2e8.data._M_elems[7];
  local_298.data._M_elems[0] = local_2e8.data._M_elems[0];
  local_298.data._M_elems[1] = local_2e8.data._M_elems[1];
  local_298.data._M_elems[2] = local_2e8.data._M_elems[2];
  local_298.data._M_elems[3] = local_2e8.data._M_elems[3];
  local_298.exp = local_2e8.exp;
  local_298.neg = local_2e8.neg;
  local_298.fpclass = local_2e8.fpclass;
  local_298.prec_elem = local_2e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=(&local_298,&local_d8);
  uVar8 = local_298._72_8_;
  bVar15 = local_298.neg;
  iVar17 = local_298.exp;
  local_1b8[0] = local_298.data._M_elems[0];
  local_1b8[1] = local_298.data._M_elems[1];
  auStack_1b0[0] = local_298.data._M_elems[2];
  auStack_1b0[1] = local_298.data._M_elems[3];
  local_1a8[0] = local_298.data._M_elems[4];
  local_1a8[1] = local_298.data._M_elems[5];
  auStack_1a0[0] = local_298.data._M_elems[6];
  auStack_1a0[1] = local_298.data._M_elems[7];
  local_198 = local_298.data._M_elems[8];
  uStack_194 = local_298.data._M_elems[9];
  uStack_190 = local_298.data._M_elems[10];
  uStack_18c = local_298.data._M_elems[0xb];
  local_188 = local_298.data._M_elems[0xc];
  uStack_184 = local_298.data._M_elems[0xd];
  uStack_180 = local_298.data._M_elems[0xe];
  uStack_17c = local_298.data._M_elems[0xf];
  local_1c8 = local_298.fpclass;
  iStack_1c4 = local_298.prec_elem;
  uStack_1c0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_128,this);
  pVVar16 = local_240;
  uVar9 = local_298._72_8_;
  local_2e8.data._M_elems[9] = uStack_194;
  local_2e8.data._M_elems[8] = local_198;
  local_2e8.data._M_elems[0xb] = uStack_18c;
  local_2e8.data._M_elems[10] = uStack_190;
  local_2e8.data._M_elems[0xd] = uStack_184;
  local_2e8.data._M_elems[0xc] = local_188;
  local_2e8.data._M_elems._56_5_ = SUB85(CONCAT44(uStack_17c,uStack_180),0);
  local_2e8.data._M_elems[0xf]._1_3_ = (undefined3)(uStack_17c >> 8);
  local_2e8.data._M_elems[4] = local_1a8[0];
  local_2e8.data._M_elems[5] = local_1a8[1];
  local_2e8.data._M_elems[6] = auStack_1a0[0];
  local_2e8.data._M_elems[7] = auStack_1a0[1];
  local_2e8.data._M_elems[0] = local_1b8[0];
  local_2e8.data._M_elems[1] = local_1b8[1];
  uVar7 = local_2e8.data._M_elems._0_8_;
  local_2e8.data._M_elems[2] = auStack_1b0[0];
  local_2e8.data._M_elems[3] = auStack_1b0[1];
  local_2e8.exp = iVar17;
  local_2e8.neg = bVar15;
  local_298.fpclass = (fpclass_type)uVar8;
  local_298.prec_elem = SUB84(uVar8,4);
  local_2e8.fpclass = local_298.fpclass;
  local_2e8.prec_elem = local_298.prec_elem;
  if ((bVar15 == true) &&
     (local_2e8.data._M_elems[0] = local_1b8[0],
     local_2e8.data._M_elems[0] != 0 || local_1c8 != cpp_dec_float_finite)) {
    local_2e8.neg = false;
  }
  local_2e8.data._M_elems._0_8_ = uVar7;
  local_298._72_8_ = uVar9;
  if (((local_1c8 != cpp_dec_float_NaN) && (local_128.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                         (&local_2e8,&local_128), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_298,0.0);
  }
  local_d8.data._M_elems[0xc] = local_298.data._M_elems[0xc];
  local_d8.data._M_elems[0xd] = local_298.data._M_elems[0xd];
  local_d8.data._M_elems._56_5_ = local_298.data._M_elems._56_5_;
  local_d8.data._M_elems[0xf]._1_3_ = local_298.data._M_elems[0xf]._1_3_;
  local_d8.data._M_elems[8] = local_298.data._M_elems[8];
  local_d8.data._M_elems[9] = local_298.data._M_elems[9];
  local_d8.data._M_elems[10] = local_298.data._M_elems[10];
  local_d8.data._M_elems[0xb] = local_298.data._M_elems[0xb];
  local_d8.data._M_elems[4] = local_298.data._M_elems[4];
  local_d8.data._M_elems[5] = local_298.data._M_elems[5];
  local_d8.data._M_elems[6] = local_298.data._M_elems[6];
  local_d8.data._M_elems[7] = local_298.data._M_elems[7];
  local_d8.data._M_elems[0] = local_298.data._M_elems[0];
  local_d8.data._M_elems[1] = local_298.data._M_elems[1];
  local_d8.data._M_elems[2] = local_298.data._M_elems[2];
  local_d8.data._M_elems[3] = local_298.data._M_elems[3];
  local_d8.exp = local_298.exp;
  local_d8.neg = local_298.neg;
  local_d8.fpclass = local_298.fpclass;
  local_d8.prec_elem = local_298.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_d8,&local_218);
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 0x10;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems[6] = 0;
  local_2e8.data._M_elems[7] = 0;
  local_2e8.data._M_elems[8] = 0;
  local_2e8.data._M_elems[9] = 0;
  local_2e8.data._M_elems[10] = 0;
  local_2e8.data._M_elems[0xb] = 0;
  local_2e8.data._M_elems[0xc] = 0;
  local_2e8.data._M_elems[0xd] = 0;
  local_2e8.data._M_elems._56_5_ = 0;
  local_2e8.data._M_elems[0xf]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2e8,&local_d8,&local_80);
  iVar17 = this->m_j;
  pnVar5 = (pVVar16->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._48_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(local_2e8.data._M_elems[0xf]._1_3_,local_2e8.data._M_elems._56_5_);
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._32_8_;
  *(undefined8 *)(puVar2 + 2) = local_2e8.data._M_elems._40_8_;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._16_8_;
  *(undefined8 *)(puVar2 + 2) = local_2e8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar17].m_backend.data = local_2e8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
  pnVar5[iVar17].m_backend.exp = local_2e8.exp;
  pnVar5[iVar17].m_backend.neg = local_2e8.neg;
  pnVar5[iVar17].m_backend.fpclass = local_2e8.fpclass;
  pnVar5[iVar17].m_backend.prec_elem = local_2e8.prec_elem;
  iVar17 = this->m_i;
  pnVar5 = (local_238->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = *(undefined8 *)(local_248->m_backend).data._M_elems;
  uVar8 = *(undefined8 *)((local_248->m_backend).data._M_elems + 2);
  uVar9 = *(undefined8 *)((local_248->m_backend).data._M_elems + 4);
  uVar10 = *(undefined8 *)((local_248->m_backend).data._M_elems + 6);
  uVar11 = *(undefined8 *)((local_248->m_backend).data._M_elems + 8);
  uVar12 = *(undefined8 *)((local_248->m_backend).data._M_elems + 10);
  uVar13 = *(undefined8 *)((local_248->m_backend).data._M_elems + 0xe);
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = *(undefined8 *)((local_248->m_backend).data._M_elems + 0xc);
  *(undefined8 *)(puVar2 + 2) = uVar13;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = uVar11;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = uVar9;
  *(undefined8 *)(puVar2 + 2) = uVar10;
  *(undefined8 *)&pnVar5[iVar17].m_backend.data = uVar7;
  *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2) = uVar8;
  pnVar5[iVar17].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar5[iVar17].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar14 = (this->m_lRhs).m_backend.prec_elem;
  pnVar5[iVar17].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar5[iVar17].m_backend.prec_elem = iVar14;
  local_2e8.fpclass = cpp_dec_float_finite;
  local_2e8.prec_elem = 0x10;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems[6] = 0;
  local_2e8.data._M_elems[7] = 0;
  local_2e8.data._M_elems[8] = 0;
  local_2e8.data._M_elems[9] = 0;
  local_2e8.data._M_elems[10] = 0;
  local_2e8.data._M_elems[0xb] = 0;
  local_2e8.data._M_elems[0xc] = 0;
  local_2e8.data._M_elems[0xd] = 0;
  local_2e8.data._M_elems._56_5_ = 0;
  local_2e8.data._M_elems[0xf]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_2e8,&(this->m_obj).m_backend,&local_80);
  iVar17 = this->m_i;
  pnVar5 = (local_230->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._48_8_;
  *(ulong *)(puVar2 + 2) =
       CONCAT35(local_2e8.data._M_elems[0xf]._1_3_,local_2e8.data._M_elems._56_5_);
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 8;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._32_8_;
  *(undefined8 *)(puVar2 + 2) = local_2e8.data._M_elems._40_8_;
  puVar2 = pnVar5[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar2 = local_2e8.data._M_elems._16_8_;
  *(undefined8 *)(puVar2 + 2) = local_2e8.data._M_elems._24_8_;
  *(undefined8 *)&pnVar5[iVar17].m_backend.data = local_2e8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar17].m_backend.data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
  pnVar5[iVar17].m_backend.exp = local_2e8.exp;
  pnVar5[iVar17].m_backend.neg = local_2e8.neg;
  pnVar5[iVar17].m_backend.fpclass = local_2e8.fpclass;
  pnVar5[iVar17].m_backend.prec_elem = local_2e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)
             ((local_228->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_220->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}